

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O1

int amqp_decode_table(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_table_t *output,size_t *offset)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  void *__src;
  void *pvVar8;
  amqp_table_entry_t_ *__dest;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  byte local_59;
  
  pvVar10 = encoded.bytes;
  uVar11 = encoded.len;
  sVar4 = *offset;
  uVar1 = sVar4 + 4;
  *offset = uVar1;
  if (uVar11 < uVar1) {
    uVar7 = 0;
  }
  else {
    uVar6 = *(uint *)((long)pvVar10 + sVar4);
    uVar7 = (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18)
    ;
  }
  uVar6 = 0xfffffffe;
  if (uVar1 <= uVar11) {
    __src = malloc(0x280);
    if (__src == (void *)0x0) {
      uVar6 = 0xffffffff;
    }
    else {
      iVar12 = 0;
      iVar13 = 0x10;
      do {
        uVar5 = *offset;
        if (uVar7 + uVar1 <= uVar5) {
          output->num_entries = iVar12;
          __dest = (amqp_table_entry_t_ *)amqp_pool_alloc(pool,(long)iVar12 * 0x28);
          output->entries = __dest;
          uVar6 = 0xffffffff;
          if (__dest != (amqp_table_entry_t_ *)0x0 || iVar12 < 1) {
            memcpy(__dest,__src,(long)iVar12 * 0x28);
            uVar6 = 0;
          }
          break;
        }
        uVar2 = uVar5 + 1;
        *offset = uVar2;
        if (uVar2 <= uVar11) {
          local_59 = *(byte *)((long)pvVar10 + uVar5);
        }
        uVar9 = 4;
        uVar6 = 0xfffffffe;
        if (uVar2 <= uVar11) {
          pvVar8 = __src;
          if (iVar13 <= iVar12) {
            iVar13 = iVar13 * 2;
            pvVar8 = realloc(__src,(long)iVar13 * 0x28);
            if (pvVar8 == (void *)0x0) {
              uVar9 = (uint)(pvVar8 == (void *)0x0) << 2;
              uVar6 = 0xffffffff;
              goto LAB_0010bcf2;
            }
          }
          __src = pvVar8;
          sVar4 = *offset;
          uVar5 = sVar4 + local_59;
          *offset = uVar5;
          if (uVar5 <= uVar11) {
            puVar3 = (ulong *)((long)__src + (long)iVar12 * 0x28);
            puVar3[1] = sVar4 + (long)pvVar10;
            *puVar3 = (ulong)local_59;
            uVar6 = amqp_decode_field_value(encoded,pool,(amqp_field_value_t *)(puVar3 + 2),offset);
            iVar12 = iVar12 - ((int)~uVar6 >> 0x1f);
            uVar9 = uVar6 >> 0x1d & 0xfffffffc;
          }
        }
LAB_0010bcf2:
      } while (uVar9 == 0);
      free(__src);
    }
  }
  return uVar6;
}

Assistant:

int amqp_decode_table(amqp_bytes_t encoded,
                      amqp_pool_t *pool,
                      amqp_table_t *output,
                      size_t *offset)
{
  uint32_t tablesize;
  int num_entries = 0;
  amqp_table_entry_t *entries;
  int allocated_entries = INITIAL_TABLE_SIZE;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &tablesize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_table_entry_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + tablesize;
  while (*offset < limit) {
    uint8_t keylen;

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_8(encoded, offset, &keylen)) {
      goto out;
    }

    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries = realloc(entries, allocated_entries * sizeof(amqp_table_entry_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_bytes(encoded, offset, &entries[num_entries].key, keylen)) {
      goto out;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries].value,
                                  offset);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries = amqp_pool_alloc(pool, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_NO_MEMORY;
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL && num_entries > 0) {
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}